

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

void __thiscall
CVmObjDict::restore_from_file(CVmObjDict *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  CVmHashTable *this_00;
  char *pcVar1;
  vmdict_TrieNode *this_01;
  vm_prop_id_t prop;
  uint old_id;
  vm_obj_id_t obj;
  long lVar2;
  ulong uVar3;
  size_t buflen;
  uint uVar4;
  char b_3 [2];
  char b [4];
  uint local_15c;
  vm_obj_id_t local_158;
  vm_obj_id_t local_154;
  CVmObjDict *local_150;
  CVmObjFixup *local_148;
  ulong local_140;
  vm_obj_id_t local_138 [66];
  
  this_00 = *(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10);
  local_154 = self;
  local_148 = fixups;
  if (this_00 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(this_00);
    operator_delete(this_00,0x20);
    pcVar1 = (this->super_CVmObject).ext_;
    pcVar1[0x10] = '\0';
    pcVar1[0x11] = '\0';
    pcVar1[0x12] = '\0';
    pcVar1[0x13] = '\0';
    pcVar1[0x14] = '\0';
    pcVar1[0x15] = '\0';
    pcVar1[0x16] = '\0';
    pcVar1[0x17] = '\0';
  }
  this_01 = *(vmdict_TrieNode **)((this->super_CVmObject).ext_ + 0x38);
  if (this_01 != (vmdict_TrieNode *)0x0) {
    vmdict_TrieNode::~vmdict_TrieNode(this_01);
    operator_delete(this_01,0x18);
    pcVar1 = (this->super_CVmObject).ext_;
    pcVar1[0x38] = '\0';
    pcVar1[0x39] = '\0';
    pcVar1[0x3a] = '\0';
    pcVar1[0x3b] = '\0';
    pcVar1[0x3c] = '\0';
    pcVar1[0x3d] = '\0';
    pcVar1[0x3e] = '\0';
    pcVar1[0x3f] = '\0';
  }
  CVmFile::read_bytes(fp,(char *)local_138,4);
  local_158 = CVmObjFixup::get_new_id(local_148,local_138[0]);
  local_150 = this;
  create_hash_table(this);
  CVmFile::read_bytes(fp,(char *)local_138,4);
  uVar3 = (ulong)local_138[0];
  if (uVar3 != 0) {
    do {
      local_140 = uVar3;
      CVmFile::read_bytes(fp,(char *)local_138,2);
      uVar3 = (ulong)(ushort)local_138[0];
      buflen = 0x100;
      if ((local_138[0] & 0xffff) < 0x100) {
        buflen = (size_t)(local_138[0] & 0xffff);
      }
      CVmFile::read_bytes(fp,(char *)local_138,buflen);
      if (0x100 < uVar3) {
        lVar2 = ftell((FILE *)fp->fp_);
        fseek((FILE *)fp->fp_,(uVar3 - buflen) + lVar2,0);
      }
      CVmFile::read_bytes(fp,(char *)&local_15c,2);
      uVar4 = local_15c & 0xffff;
      if ((vm_prop_id_t)local_15c != 0) {
        do {
          CVmFile::read_bytes(fp,(char *)&local_15c,4);
          old_id = local_15c;
          CVmFile::read_bytes(fp,(char *)&local_15c,2);
          prop = (vm_prop_id_t)local_15c;
          obj = CVmObjFixup::get_new_id(local_148,old_id);
          if (obj != 0) {
            add_hash_entry(local_150,(char *)local_138,uVar3,1,obj,prop,0);
          }
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      uVar3 = local_140 - 1;
    } while (uVar3 != 0);
  }
  *(vm_obj_id_t *)((local_150->super_CVmObject).ext_ + 0x20) = local_158;
  pcVar1 = (local_150->super_CVmObject).ext_;
  pcVar1[0x30] = '\0';
  pcVar1[0x31] = '\0';
  pcVar1[0x32] = '\0';
  pcVar1[0x33] = '\0';
  pcVar1 = (local_150->super_CVmObject).ext_;
  pcVar1[0x28] = '\0';
  pcVar1[0x29] = '\0';
  pcVar1[0x2a] = '\0';
  pcVar1[0x2b] = '\0';
  pcVar1[0x2c] = '\0';
  pcVar1[0x2d] = '\0';
  pcVar1[0x2e] = '\0';
  pcVar1[0x2f] = '\0';
  pcVar1 = (local_150->super_CVmObject).ext_;
  pcVar1[0x18] = '\x01';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  CVmObjTable::request_post_load_init(&G_obj_table_X,local_154);
  return;
}

Assistant:

void CVmObjDict::restore_from_file(VMG_ vm_obj_id_t self,
                                   CVmFile *fp, CVmObjFixup *fixups)
{
    ulong cnt;
    vm_obj_id_t comp;

    /* delete the old hash table if we have one */
    if (get_ext()->hashtab_ != 0)
    {
        delete get_ext()->hashtab_;
        get_ext()->hashtab_ = 0;
    }

    /* delete the Trie if we have one */
    if (get_ext()->trie_ != 0)
    {
        delete get_ext()->trie_;
        get_ext()->trie_ = 0;
    }

    /* 
     *   Read the comparator and fix it up to the new object numbering
     *   scheme, but do not install it (as it might not be loaded yet).  
     */
    comp = fixups->get_new_id(vmg_ (vm_obj_id_t)fp->read_uint4());

    /* create the new, empty hash table */
    create_hash_table(vmg0_);

    /* read the number of symbols */
    cnt = fp->read_uint4();

    /* read the symbols */
    for ( ; cnt != 0 ; --cnt)
    {
        uint len;
        uint read_len;
        char buf[256];
        uint item_cnt;
        
        /* read the symbol length */
        len = fp->read_uint2();

        /* limit the reading to our buffer size */
        read_len = len;
        if (read_len > sizeof(buf))
            read_len = sizeof(buf);

        /* read the string */
        fp->read_bytes(buf, read_len);

        /* skip any extra data */
        if (len > read_len)
            fp->set_pos(fp->get_pos() + len - read_len);

        /* read the item count */
        item_cnt = fp->read_uint2();

        /* read the items */
        for ( ; item_cnt != 0 ; --item_cnt)
        {
            vm_obj_id_t obj;
            vm_prop_id_t prop;
            
            /* read the object and property ID's */
            obj = (vm_obj_id_t)fp->read_uint4();
            prop = (vm_prop_id_t)fp->read_uint2();

            /* translate the object ID through the fixup table */
            obj = fixups->get_new_id(vmg_ obj);

            /* add the entry, if it refers to a valid object */
            if (obj != VM_INVALID_OBJ)
                add_hash_entry(vmg_ buf, len, TRUE, obj, prop, FALSE);
        }
    }

    /* 
     *   install the comparator (we can't set its type yet, though, because
     *   the object might not be loaded yet) 
     */
    get_ext()->comparator_ = comp;
    set_comparator_type(vmg_ VM_INVALID_OBJ);

    /*
     *   If we had to restore it, we'll have to save it if the current state
     *   is later saved, even if we don't modify it again.  The fact that
     *   this version was saved before means this version has to be saved
     *   from now on.  
     */
    get_ext()->modified_ = TRUE;

    /* 
     *   register for post-load initialization, so that we can rebuild the
     *   hash table with the actual comparator if necessary 
     */
    G_obj_table->request_post_load_init(self);
}